

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameOperator.cpp
# Opt level: O3

int __thiscall GameOperator::getkey(GameOperator *this)

{
  int iVar1;
  termios newattr;
  termios oldattr;
  termios local_88;
  termios local_4c;
  
  tcgetattr(0,&local_4c);
  local_88.c_iflag = local_4c.c_iflag;
  local_88.c_oflag = local_4c.c_oflag;
  local_88.c_line = local_4c.c_line;
  local_88.c_cc[0] = local_4c.c_cc[0];
  local_88.c_cc[1] = local_4c.c_cc[1];
  local_88.c_cc[2] = local_4c.c_cc[2];
  local_88.c_cc[3] = local_4c.c_cc[3];
  local_88.c_cc[4] = local_4c.c_cc[4];
  local_88.c_cc[5] = local_4c.c_cc[5];
  local_88.c_cc[6] = local_4c.c_cc[6];
  local_88.c_cc[7] = local_4c.c_cc[7];
  local_88.c_cc[8] = local_4c.c_cc[8];
  local_88.c_cc[9] = local_4c.c_cc[9];
  local_88.c_cc[10] = local_4c.c_cc[10];
  local_88.c_cc[0xb] = local_4c.c_cc[0xb];
  local_88.c_cc[0xc] = local_4c.c_cc[0xc];
  local_88.c_cc[0xd] = local_4c.c_cc[0xd];
  local_88.c_cc[0xe] = local_4c.c_cc[0xe];
  local_88.c_cc[0xf] = local_4c.c_cc[0xf];
  local_88.c_cc[0x10] = local_4c.c_cc[0x10];
  local_88.c_cc[0x11] = local_4c.c_cc[0x11];
  local_88.c_cc[0x12] = local_4c.c_cc[0x12];
  local_88.c_cc[0x13] = local_4c.c_cc[0x13];
  local_88.c_cc[0x14] = local_4c.c_cc[0x14];
  local_88.c_cc[0x15] = local_4c.c_cc[0x15];
  local_88.c_cc[0x16] = local_4c.c_cc[0x16];
  local_88.c_ispeed = local_4c.c_ispeed;
  local_88.c_ospeed = local_4c.c_ospeed;
  local_88._8_8_ = local_4c._8_8_ & 0xfffffff5ffffffff;
  tcsetattr(0,0,&local_88);
  iVar1 = getchar();
  tcsetattr(0,0,&local_4c);
  return iVar1;
}

Assistant:

int GameOperator::getkey() {
#ifdef _WIN32
    return getch();
#else
    struct termios oldattr, newattr;
    int ch;
    tcgetattr(STDIN_FILENO, &oldattr);
    newattr = oldattr;
    newattr.c_lflag &= ~(ICANON | ECHO);
    tcsetattr(STDIN_FILENO, TCSANOW, &newattr);
    ch = getchar();
    tcsetattr(STDIN_FILENO, TCSANOW, &oldattr);
    return ch;
#endif
}